

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FMultiBlockThingsIterator::FMultiBlockThingsIterator
          (FMultiBlockThingsIterator *this,FPortalGroupArray *check,AActor *origin,
          double checkradius,bool ignorerestricted)

{
  double dVar1;
  double dVar2;
  short sVar3;
  
  this->checklist = check;
  FBlockThingsIterator::FBlockThingsIterator(&this->blockIterator);
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  dVar1 = (origin->__Pos).X;
  dVar2 = (origin->__Pos).Y;
  (this->checkpoint).Z = (origin->__Pos).Z;
  (this->checkpoint).X = dVar1;
  (this->checkpoint).Y = dVar2;
  if (check->inited == false) {
    P_CollectConnectedGroups
              (origin->Sector->PortalGroup,&this->checkpoint,(origin->__Pos).Z + origin->Height,
               checkradius,this->checklist);
  }
  if ((checkradius == -1.0) && (!NAN(checkradius))) {
    checkradius = origin->radius;
  }
  (this->checkpoint).Z = checkradius;
  sVar3 = (short)origin->Sector->PortalGroup;
  this->basegroup = sVar3;
  this->portalflags = 0;
  this->index = -1;
  startIteratorForGroup(this,(int)sVar3);
  return;
}

Assistant:

FMultiBlockThingsIterator::FMultiBlockThingsIterator(FPortalGroupArray &check, AActor *origin, double checkradius, bool ignorerestricted)
	: checklist(check)
{
	checkpoint = origin->Pos();
	if (!check.inited) P_CollectConnectedGroups(origin->Sector->PortalGroup, checkpoint, origin->Top(), checkradius, checklist);
	checkpoint.Z = checkradius == -1? origin->radius : checkradius;
	basegroup = origin->Sector->PortalGroup;
	Reset();
}